

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zpruneL.c
# Opt level: O2

void zpruneL(int jcol,int *perm_r,int pivrow,int nseg,int *segrep,int *repfnz,int_t *xprune,
            GlobalLU_t *Glu)

{
  int *piVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  int *piVar10;
  int_t *piVar11;
  int_t *piVar12;
  void *pvVar13;
  int_t *piVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  doublecomplex utemp;
  
  piVar9 = Glu->xsup;
  piVar10 = Glu->supno;
  piVar11 = Glu->lsub;
  piVar12 = Glu->xlsub;
  pvVar13 = Glu->lusup;
  piVar14 = Glu->xlusup;
  iVar4 = piVar10[jcol];
  uVar24 = 0;
  uVar20 = (ulong)(uint)nseg;
  if (nseg < 1) {
    uVar20 = uVar24;
  }
  do {
    if (uVar24 == uVar20) {
      return;
    }
    iVar5 = segrep[uVar24];
    if ((((repfnz[iVar5] != -1) && (iVar6 = piVar10[iVar5], iVar6 != piVar10[(long)iVar5 + 1])) &&
        (iVar6 != iVar4)) && (iVar7 = piVar12[(long)iVar5 + 1], iVar7 <= xprune[iVar5])) {
      uVar23 = (ulong)(uint)piVar12[iVar5];
      lVar19 = (long)piVar12[iVar5];
      while (lVar19 < iVar7) {
        piVar1 = piVar11 + lVar19;
        lVar19 = lVar19 + 1;
        if (*piVar1 == pivrow) {
          iVar6 = piVar9[iVar6];
LAB_00109a3e:
          do {
            iVar18 = iVar7;
            iVar7 = iVar18 + -1;
            uVar23 = (ulong)(int)uVar23;
            while( true ) {
              iVar22 = (int)uVar23;
              if (iVar18 <= iVar22) {
                xprune[iVar5] = iVar22;
                goto LAB_00109adb;
              }
              if (perm_r[piVar11[iVar7]] == -1) goto LAB_00109a3e;
              iVar8 = piVar11[uVar23];
              if (perm_r[iVar8] == -1) break;
              uVar23 = uVar23 + 1;
            }
            piVar11[uVar23] = piVar11[iVar7];
            piVar11[iVar7] = iVar8;
            if (iVar5 == iVar6) {
              lVar21 = (long)((piVar14[iVar5] - piVar12[iVar5]) + iVar22) * 0x10;
              puVar2 = (undefined8 *)((long)pvVar13 + lVar21);
              uVar15 = *puVar2;
              uVar16 = puVar2[1];
              lVar19 = (long)((piVar14[iVar5] + iVar7) - piVar12[iVar5]) * 0x10;
              puVar2 = (undefined8 *)((long)pvVar13 + lVar19);
              uVar17 = puVar2[1];
              puVar3 = (undefined8 *)((long)pvVar13 + lVar21);
              *puVar3 = *puVar2;
              puVar3[1] = uVar17;
              puVar2 = (undefined8 *)((long)pvVar13 + lVar19);
              *puVar2 = uVar15;
              puVar2[1] = uVar16;
            }
            uVar23 = (ulong)(iVar22 + 1);
          } while( true );
        }
      }
    }
LAB_00109adb:
    uVar24 = uVar24 + 1;
  } while( true );
}

Assistant:

void
zpruneL(
       const int  jcol,	     /* in */
       const int  *perm_r,   /* in */
       const int  pivrow,    /* in */
       const int  nseg,	     /* in */
       const int  *segrep,   /* in */
       const int  *repfnz,   /* in */
       int_t      *xprune,   /* out */
       GlobalLU_t *Glu       /* modified - global LU data structures */
       )
{

    doublecomplex     utemp;
    int        jsupno, irep, irep1, kmin, kmax, krow, movnum;
    int_t      i, ktemp, minloc, maxloc;
    int        do_prune; /* logical variable */
    int        *xsup, *supno;
    int_t      *lsub, *xlsub;
    doublecomplex     *lusup;
    int_t      *xlusup;

    xsup       = Glu->xsup;
    supno      = Glu->supno;
    lsub       = Glu->lsub;
    xlsub      = Glu->xlsub;
    lusup      = (doublecomplex *) Glu->lusup;
    xlusup     = Glu->xlusup;
    
    /*
     * For each supernode-rep irep in U[*,j]
     */
    jsupno = supno[jcol];
    for (i = 0; i < nseg; i++) {

	irep = segrep[i];
	irep1 = irep + 1;
	do_prune = FALSE;

	/* Don't prune with a zero U-segment */
 	if ( repfnz[irep] == SLU_EMPTY )
		continue;

     	/* If a snode overlaps with the next panel, then the U-segment 
   	 * is fragmented into two parts -- irep and irep1. We should let
	 * pruning occur at the rep-column in irep1's snode. 
	 */
	if ( supno[irep] == supno[irep1] ) 	/* Don't prune */
		continue;

	/*
	 * If it has not been pruned & it has a nonz in row L[pivrow,i]
	 */
	if ( supno[irep] != jsupno ) {
	    if ( xprune[irep] >= xlsub[irep1] ) {
		kmin = xlsub[irep];
		kmax = xlsub[irep1] - 1;
		for (krow = kmin; krow <= kmax; krow++) 
		    if ( lsub[krow] == pivrow ) {
			do_prune = TRUE;
			break;
		    }
	    }
	    
    	    if ( do_prune ) {

	     	/* Do a quicksort-type partition
	     	 * movnum=TRUE means that the num values have to be exchanged.
	     	 */
	        movnum = FALSE;
	        if ( irep == xsup[supno[irep]] ) /* Snode of size 1 */
			movnum = TRUE;

	        while ( kmin <= kmax ) {

	    	    if ( perm_r[lsub[kmax]] == SLU_EMPTY ) 
			kmax--;
		    else if ( perm_r[lsub[kmin]] != SLU_EMPTY )
			kmin++;
		    else { /* kmin below pivrow (not yet pivoted), and kmax
                            * above pivrow: interchange the two subscripts
			    */
		        ktemp = lsub[kmin];
		        lsub[kmin] = lsub[kmax];
		        lsub[kmax] = ktemp;

			/* If the supernode has only one column, then we
 			 * only keep one set of subscripts. For any subscript 
			 * interchange performed, similar interchange must be 
			 * done on the numerical values.
 			 */
		        if ( movnum ) {
		    	    minloc = xlusup[irep] + (kmin - xlsub[irep]);
		    	    maxloc = xlusup[irep] + (kmax - xlsub[irep]);
			    utemp = lusup[minloc];
		  	    lusup[minloc] = lusup[maxloc];
			    lusup[maxloc] = utemp;
		        }

		        kmin++;
		        kmax--;

		    }

	        } /* while */

	        xprune[irep] = kmin;	/* Pruning */

#ifdef CHK_PRUNE
	printf("    After zpruneL(),using col %d:  xprune[%d] = %d\n", 
			jcol, irep, kmin);
#endif
	    } /* if do_prune */

	} /* if */

    } /* for each U-segment... */
}